

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::AddSegmentAsFallback<segment_command_64,section_64>
               (string_view command_data,string_view file_data,RangeSink *sink)

{
  string_view data;
  string_view data_00;
  string_view separator;
  string_view name;
  string_view name_00;
  string_view file_range;
  string_view file_range_00;
  Arena *in_RCX;
  Rep *in_RDX;
  char *in_R8;
  undefined1 auVar1 [16];
  string_view sVar2;
  string_view sVar3;
  string label;
  uint64_t filesize;
  section_64 *section;
  uint32_t j;
  uint32_t nsects;
  string_view segname;
  segment_command_64 *segment;
  size_t in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdb0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *in_stack_fffffffffffffdb8;
  string_view *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  uint64_t in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe08;
  RangeSink *in_stack_fffffffffffffe10;
  undefined1 *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  size_t in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  allocator<char> local_1a9;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  undefined1 local_148 [16];
  Rep *local_138;
  Arena *pAStack_130;
  string_view local_128;
  undefined1 local_118 [16];
  string local_f8 [32];
  basic_string_view<char,_std::char_traits<char>_> local_d8 [3];
  string_view local_a8;
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint64_t local_58;
  section_64 *local_50;
  uint local_48;
  uint local_44;
  string_view local_40;
  Arena *local_30;
  char *local_28;
  Rep *local_20;
  Arena *pAStack_18;
  
  local_28 = in_R8;
  local_20 = in_RDX;
  pAStack_18 = in_RCX;
  local_30 = (Arena *)GetStructPointerAndAdvance<segment_command_64>(in_stack_fffffffffffffdc0);
  if (*(int *)&(local_30->impl_).options_.initial_block != 0) {
    local_40 = ArrayToStr(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    sVar3._M_str = in_stack_fffffffffffffe00;
    sVar3._M_len = in_stack_fffffffffffffe08;
    sVar2._M_str = in_stack_fffffffffffffda0;
    sVar2._M_len = in_stack_fffffffffffffd98;
    local_44 = (uint)(local_30->impl_).options_.initial_block_size;
    for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
      local_50 = GetStructPointerAndAdvance<section_64>(in_stack_fffffffffffffdc0);
      local_58 = local_50->size;
      in_stack_fffffffffffffe24 = (uint)(byte)local_50->flags;
      if (((in_stack_fffffffffffffe24 == 1) || (in_stack_fffffffffffffe24 == 0xc)) ||
         (in_stack_fffffffffffffe24 == 0x12)) {
        local_58 = 0;
      }
      local_a8 = ArrayToStr(sVar2._M_str,sVar2._M_len);
      in_stack_fffffffffffffe10 = (RangeSink *)local_98;
      std::
      make_tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffda8,
                 (basic_string_view<char,_std::char_traits<char>_> *)sVar2._M_str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      in_stack_fffffffffffffe18 = local_98 + 0x20;
      separator._M_str = in_stack_fffffffffffffdc8;
      separator._M_len = (size_t)in_stack_fffffffffffffdc0;
      absl::
      StrJoin<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_fffffffffffffdb8,separator);
      std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      std::operator+(in_stack_fffffffffffffda8,sVar2._M_str);
      in_stack_fffffffffffffde0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x20);
      in_stack_fffffffffffffdd8 = local_d8;
      std::__cxx11::string::operator=
                ((string *)in_stack_fffffffffffffde0,(string *)in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string(local_f8);
      in_stack_fffffffffffffde8 = local_28;
      auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)in_stack_fffffffffffffde0);
      in_stack_fffffffffffffdf8 = local_50->size;
      local_138 = local_20;
      pAStack_130 = pAStack_18;
      data._M_str = (char *)in_stack_fffffffffffffdc0;
      data._M_len = (size_t)in_stack_fffffffffffffdb8;
      local_118 = auVar1;
      sVar2 = StrictSubstr(data,(size_t)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8)
      ;
      name._M_str._0_4_ = in_stack_fffffffffffffe20;
      name._M_len = (size_t)in_stack_fffffffffffffe18;
      name._M_str._4_4_ = in_stack_fffffffffffffe24;
      file_range._M_str = in_stack_fffffffffffffe38;
      file_range._M_len = in_stack_fffffffffffffe30;
      sVar3 = sVar2;
      local_128 = sVar2;
      RangeSink::AddRange(in_stack_fffffffffffffe10,(char *)sVar2._M_len,name,(uint64_t)sVar2._M_str
                          ,in_stack_fffffffffffffdf8,file_range);
      std::__cxx11::string::~string((string *)(local_98 + 0x20));
    }
    __a = &local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,__a);
    std::operator+((char *)in_stack_fffffffffffffda8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar2._M_str
                  );
    std::operator+(in_stack_fffffffffffffda8,sVar2._M_str);
    local_148 = std::__cxx11::string::operator_cast_to_basic_string_view(local_168);
    data_00._M_str = (char *)in_stack_fffffffffffffdc0;
    data_00._M_len = (size_t)in_stack_fffffffffffffdb8;
    StrictSubstr(data_00,(local_30->impl_).lifecycle_id_,(size_t)(local_30->impl_).initial_block_);
    name_00._M_str._0_4_ = in_stack_fffffffffffffe20;
    name_00._M_len = (size_t)in_stack_fffffffffffffe18;
    name_00._M_str._4_4_ = in_stack_fffffffffffffe24;
    file_range_00._M_str = in_stack_fffffffffffffe38;
    file_range_00._M_len = (size_t)pAStack_18;
    RangeSink::AddRange(in_stack_fffffffffffffe10,(char *)sVar3._M_len,name_00,
                        (uint64_t)sVar3._M_str,in_stack_fffffffffffffdf8,file_range_00);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
  }
  return;
}

Assistant:

void AddSegmentAsFallback(string_view command_data, string_view file_data,
                          RangeSink* sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&command_data);

  if (segment->maxprot == VM_PROT_NONE) {
    return;
  }

  string_view segname = ArrayToStr(segment->segname, 16);

  uint32_t nsects = segment->nsects;
  for (uint32_t j = 0; j < nsects; j++) {
    auto section = GetStructPointerAndAdvance<Section>(&command_data);

    // filesize equals vmsize unless the section is zerofill
    uint64_t filesize = section->size;
    switch (section->flags & SECTION_TYPE) {
      case S_ZEROFILL:
      case S_GB_ZEROFILL:
      case S_THREAD_LOCAL_ZEROFILL:
        filesize = 0;
        break;
      default:
        break;
    }

    std::string label = absl::StrJoin(
        std::make_tuple(segname, ArrayToStr(section->sectname, 16)), ",");
    label = "[" + label + "]";
    sink->AddRange("macho_fallback", label, section->addr, section->size,
                   StrictSubstr(file_data, section->offset, filesize));
  }

  sink->AddRange("macho_fallback", "[" + std::string(segname) + "]",
                 segment->vmaddr, segment->vmsize,
                 StrictSubstr(file_data, segment->fileoff, segment->filesize));
}